

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O0

void __thiscall ObserverManager_Stack_Test::TestBody(ObserverManager_Stack_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2a8;
  Message local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_258;
  Message local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  allocator local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  A a;
  stringstream out;
  ostream local_188 [376];
  ObserverManager_Stack_Test *local_10;
  ObserverManager_Stack_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)(a.name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"A",&local_1f1);
  A::A((A *)local_1d0,local_188,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  ObserverManager::subscribe<FooBarProtocol,A>((A *)local_1d0);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11
  ;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"A \"","out.str()",(char (*) [3])0x1b579b,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  A::~A((A *)local_1d0);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_278,"\"A \"","out.str()",(char (*) [3])0x1b579b,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  std::__cxx11::stringstream::~stringstream((stringstream *)(a.name.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST(ObserverManager, Stack) {
    std::stringstream out;

    {
        A a(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a);
        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A ", out.str());
}